

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O0

void __thiscall
MPL::detail::ModelPackageImpl::ModelPackageImpl
          (ModelPackageImpl *this,path *path,bool createIfNecessary,bool readOnly)

{
  char *__s;
  path *ppVar1;
  bool bVar2;
  byte bVar3;
  runtime_error *prVar4;
  ostream *poVar5;
  pointer this_00;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_540;
  allocator<char> local_519;
  string local_518;
  stringstream local_4f8 [8];
  stringstream ss;
  undefined1 local_4e8 [376];
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> local_370;
  undefined1 local_361;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_319;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d1;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> local_290;
  ifstream local_288 [8];
  ifstream manifestStream;
  path local_80;
  path local_48;
  byte local_1a;
  byte local_19;
  bool readOnly_local;
  path *ppStack_18;
  bool createIfNecessary_local;
  path *path_local;
  ModelPackageImpl *this_local;
  
  local_1a = readOnly;
  local_19 = createIfNecessary;
  ppStack_18 = path;
  path_local = &this->m_packagePath;
  std::filesystem::__cxx11::path::path(&this->m_packagePath,path);
  ppVar1 = ppStack_18;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_48,&kModelPackageManifestFileName,auto_format);
  std::filesystem::__cxx11::operator/(&this->m_manifestPath,ppVar1,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  ppVar1 = ppStack_18;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_80,&kModelPackageDataDir,auto_format);
  std::filesystem::__cxx11::operator/(&this->m_packageDataDirPath,ppVar1,&local_80);
  std::filesystem::__cxx11::path::~path(&local_80);
  std::unique_ptr<JsonMap,std::default_delete<JsonMap>>::
  unique_ptr<std::default_delete<JsonMap>,void>
            ((unique_ptr<JsonMap,std::default_delete<JsonMap>> *)&this->m_manifest,(nullptr_t)0x0);
  this->m_readOnly = (bool)(local_1a & 1);
  bVar2 = std::filesystem::exists(&this->m_packagePath);
  if (bVar2) {
    bVar2 = std::filesystem::exists(&this->m_manifestPath);
    if (!bVar2) {
      local_2d1 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_2d0,&this->m_manifestPath);
      std::operator+(&local_2b0,"A valid manifest does not exist at path: ",&local_2d0);
      std::runtime_error::runtime_error(prVar4,(string *)&local_2b0);
      local_2d1 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
              (local_288,&this->m_manifestPath,_S_bin);
    std::make_unique<JsonMap,std::ifstream&>
              ((basic_ifstream<char,_std::char_traits<char>_> *)&local_290);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator=(&this->m_manifest,&local_290)
    ;
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&local_290);
    std::ifstream::close();
    std::ifstream::~ifstream(local_288);
  }
  else {
    if ((local_19 & 1) == 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_580,&this->m_packagePath);
      std::operator+(&local_560,"Failed to open model package at path: ",&local_580);
      std::runtime_error::runtime_error(prVar4,(string *)&local_560);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = std::filesystem::create_directory(&this->m_packagePath);
    if ((bVar3 & 1) == 0) {
      local_319 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_318,&this->m_packagePath);
      std::operator+(&local_2f8,"Failed to create model package at path: ",&local_318);
      std::runtime_error::runtime_error(prVar4,(string *)&local_2f8);
      local_319 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar3 = std::filesystem::create_directory(&this->m_packageDataDirPath);
    if ((bVar3 & 1) == 0) {
      local_361 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::filesystem::__cxx11::path::string(&local_360,&this->m_packageDataDirPath);
      std::operator+(&local_340,"Failed to create data directory at path: ",&local_360);
      std::runtime_error::runtime_error(prVar4,(string *)&local_340);
      local_361 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_unique<JsonMap>();
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator=(&this->m_manifest,&local_370)
    ;
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&local_370);
    std::__cxx11::stringstream::stringstream(local_4f8);
    poVar5 = (ostream *)std::ostream::operator<<(local_4e8,1);
    poVar5 = std::operator<<(poVar5,".");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    poVar5 = std::operator<<(poVar5,".");
    std::ostream::operator<<(poVar5,0);
    this_00 = std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::operator->(&this->m_manifest)
    ;
    __s = kModelPackageFileFormatVersionKey;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,__s,&local_519);
    std::__cxx11::stringstream::str();
    JsonMap::setString(this_00,&local_518,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::__cxx11::stringstream::~stringstream(local_4f8);
  }
  validate(this);
  return;
}

Assistant:

ModelPackageImpl::ModelPackageImpl(const std::filesystem::path& path, bool createIfNecessary, bool readOnly)
: m_packagePath(path),
  m_manifestPath(path / kModelPackageManifestFileName),
  m_packageDataDirPath(path / kModelPackageDataDir),
  m_manifest(nullptr),
  m_readOnly(readOnly)
{
    if (std::filesystem::exists(m_packagePath)) {
        if (std::filesystem::exists(m_manifestPath)) {
            std::ifstream manifestStream(m_manifestPath, std::ios::binary);
            m_manifest = std::make_unique<JsonMap>(manifestStream);
            manifestStream.close();
        } else {
            throw std::runtime_error("A valid manifest does not exist at path: " + m_manifestPath.string());
        }
    }
    // Create the package structure at specified path
    else if (createIfNecessary) {
        if (false == create_directory(m_packagePath)) {
            throw std::runtime_error("Failed to create model package at path: " + m_packagePath.string());
        }
        
        if (false == create_directory(m_packageDataDirPath)) {
            throw std::runtime_error("Failed to create data directory at path: " + m_packageDataDirPath.string());
        }
        
        m_manifest = std::make_unique<JsonMap>();
        std::stringstream ss;
        ss << kModelPackageFileFormatMajorVersion << "." << kModelPackageFileFormatMinorVersion << "." << kModelPackageFileFormatPatchVersion;
        m_manifest->setString(kModelPackageFileFormatVersionKey, ss.str());
    }
    // Error out since package does not exist
    else {
        throw std::runtime_error("Failed to open model package at path: " + m_packagePath.string());
    }
    
    validate();
}